

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

Script * cfd::core::ScriptUtil::CreateP2pkhLockingScript
                   (Script *__return_storage_ptr__,Pubkey *pubkey)

{
  ByteData160 pubkey_hash;
  ByteData160 local_28;
  
  HashUtil::Hash160(&local_28,pubkey);
  CreateP2pkhLockingScript(__return_storage_ptr__,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2pkhLockingScript(const Pubkey& pubkey) {
  // create pubkey hash
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);

  return CreateP2pkhLockingScript(pubkey_hash);
}